

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_arg * __thiscall
fmt::v5::
basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>::
get_arg(format_arg *__return_storage_ptr__,
       basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
       *this,basic_string_view<char> name)

{
  basic_string_view<char> name_00;
  type tVar1;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  local_30;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
  *local_20;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
  *this_local;
  basic_string_view<char> name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
                *)name.data_;
  local_20 = this;
  local_30 = internal::
             context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
             ::args(&this->
                     super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                   );
  internal::
  arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  ::init(&this->map_,(EVP_PKEY_CTX *)&local_30);
  name_00.size_ = (size_t)name_local.data_;
  name_00.data_ = (char *)this_local;
  internal::
  arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  ::find(__return_storage_ptr__,&this->map_,name_00);
  tVar1 = basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          ::type(__return_storage_ptr__);
  if (tVar1 == none_type) {
    internal::
    context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
    ::on_error(&this->
                super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
               ,"argument not found");
  }
  return __return_storage_ptr__;
}

Assistant:

typename basic_format_context<Range, Char>::format_arg
  basic_format_context<Range, Char>::get_arg(
    basic_string_view<char_type> name) {
  map_.init(this->args());
  format_arg arg = map_.find(name);
  if (arg.type() == internal::none_type)
    this->on_error("argument not found");
  return arg;
}